

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb_fastpforlib::internal::__fastunpack4(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t outer;
  long lVar2;
  
  for (outer = 0; outer != 4; outer = outer + 1) {
    uVar1 = *in;
    for (lVar2 = 0; (uint)lVar2 < 0x20; lVar2 = lVar2 + 4) {
      *(uint *)((long)out + lVar2) = uVar1 >> ((byte)lVar2 & 0x1f) & 0xf;
    }
    in = in + 1;
    out = (uint32_t *)((long)out + lVar2);
  }
  return;
}

Assistant:

void __fastunpack4(const uint32_t *__restrict in, uint32_t *__restrict out) {
	for (uint32_t outer = 0; outer < 4; ++outer) {
		for (uint32_t inwordpointer = 0; inwordpointer < 32; inwordpointer += 4)
			*(out++) = ((*in) >> inwordpointer) % (1U << 4);
		++in;
	}
}